

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

void __thiscall VariationalBayesEstimatorOnLDA::updateQz(VariationalBayesEstimatorOnLDA *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  pointer pvVar5;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar6;
  int k_1;
  pointer pvVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int k;
  ulong uVar11;
  ulong uVar12;
  type tVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_58;
  
  pvVar6 = this->_docVoca;
  pvVar7 = (pvVar6->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar9 = 0;
      uVar9 < (ulong)(((long)(pvVar6->
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18);
      uVar9 = uVar9 + 1) {
    for (uVar8 = 0;
        lVar10 = *(long *)&pvVar7[uVar9].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data,
        uVar8 < (ulong)((long)*(pointer *)
                               ((long)&pvVar7[uVar9].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar10 >> 2);
        uVar8 = uVar8 + 1) {
      uVar12 = (ulong)*(uint *)(lVar10 + uVar8 * 4);
      local_58 = 0.0;
      lVar10 = 0;
      for (uVar11 = 0; uVar4 = this->_K, uVar11 < uVar4; uVar11 = uVar11 + 1) {
        dVar15 = *(double *)
                  (*(long *)&(this->_ndk).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar9].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data + uVar11 * 8);
        dVar16 = (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        dVar17 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        dVar1 = this->_betaSum;
        dVar2 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        dVar3 = this->_alphaSum;
        tVar13 = boost::math::digamma<double>
                           (*(double *)
                             (*(long *)((long)&(((this->_nkv).
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + lVar10) +
                             uVar12 * 8) +
                            (this->_beta).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar12]);
        dVar14 = exp(tVar13);
        tVar13 = boost::math::digamma<double>(dVar15 + dVar16);
        dVar15 = exp(tVar13);
        tVar13 = boost::math::digamma<double>(dVar17 + dVar1);
        dVar16 = exp(tVar13);
        tVar13 = boost::math::digamma<double>(dVar2 + dVar3);
        dVar17 = exp(tVar13);
        dVar15 = (dVar14 * dVar15) / (dVar16 * dVar17);
        local_58 = local_58 + dVar15;
        *(double *)
         (*(long *)(*(long *)&(this->_qz).
                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar9].
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data + uVar8 * 0x18) + uVar11 * 8) =
             dVar15;
        lVar10 = lVar10 + 0x18;
      }
      pvVar5 = (this->_qz).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
        lVar10 = *(long *)(*(long *)&pvVar5[uVar9].
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data + uVar8 * 0x18);
        *(double *)(lVar10 + uVar11 * 8) = *(double *)(lVar10 + uVar11 * 8) / local_58;
      }
      pvVar6 = this->_docVoca;
      pvVar7 = (pvVar6->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateQz(){//{{{
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            double Zq = 0;
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                double term1 = 0, term2 = 0, term3 = 0, term4 = 0;
                double xikv = _nkv[k][v] + _beta[v];
                double xidk = _ndk[d][k] + _alpha[k];
                double xik = _nk[k] + _betaSum;
                double xid = _nd[d] + _alphaSum;
                try{
                    term1 = exp(boost::math::digamma(xikv));
                }catch(...){
                    term1 = 0;
                }
                try{
                    term2 = exp(boost::math::digamma(xidk));
                }catch(...){
                    term2 = 0;
                }
                try{
                    term3 = exp(boost::math::digamma(xik));
                }catch(...){
                    term3 = 0;
                }
                try{
                    term4 = exp(boost::math::digamma(xid));
                }catch(...){
                    term4 = 0;
                }
                double constProbability = (term1 * term2) / (term3 * term4);
                Zq += constProbability;
                _qz[d][l][k] = constProbability;
            }
            for(int k=0; k<_K; k++){
                _qz[d][l][k] /= Zq;
            }
        }
    }
}